

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

leb_DiamondParent leb_DecodeDiamondParent(leb_Node node)

{
  leb_DiamondParent lVar1;
  leb_Node node_00;
  leb_SameDepthNeighborIDs lVar2;
  undefined4 local_64;
  leb_Node diamondNode;
  undefined4 local_3c;
  uint32_t diamondNodeID;
  undefined4 local_28;
  undefined4 uStack_24;
  leb_Node parentNode;
  leb_Node node_local;
  
  node_00 = leb_ParentNode(node);
  lVar2 = leb_DecodeSameDepthNeighborIDs(node_00);
  local_3c = lVar2.edge;
  if (local_3c == 0) {
    local_28 = node_00.id;
    local_64 = local_28;
  }
  else {
    local_64 = local_3c;
  }
  uStack_24 = node_00.depth;
  lVar1.top.depth = uStack_24;
  lVar1.top.id = local_64;
  lVar1.base = node_00;
  return lVar1;
}

Assistant:

LEBDEF leb_DiamondParent leb_DecodeDiamondParent(const leb_Node node)
{
    leb_Node parentNode = leb_ParentNode(node);
    uint32_t diamondNodeID = leb_DecodeSameDepthNeighborIDs(parentNode).edge;
    leb_Node diamondNode = {
        diamondNodeID > 0u ? diamondNodeID : parentNode.id,
        parentNode.depth
    };

    return {parentNode, diamondNode};
}